

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

Var Js::JavascriptDate::EntryGetYear(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  uint uVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptDate *pJVar8;
  ScriptContext *pSVar9;
  double dVar10;
  int in_stack_00000010;
  Var local_38;
  Var result;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar9 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar9->threadContext,0xc00,pSVar9,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x17e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bc4d8f;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar9 = (ScriptContext *)&args.super_Arguments.Values;
  result = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar9);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    pSVar9 = (ScriptContext *)0x181;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x181,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bc4d8f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar9 = (ScriptContext *)0x0;
    pvVar7 = Arguments::operator[]((Arguments *)&result,0);
    bVar4 = VarIs<Js::JavascriptDate>(pvVar7);
    if (bVar4) {
      pvVar7 = Arguments::operator[]((Arguments *)&result,0);
      pJVar8 = VarTo<Js::JavascriptDate>(pvVar7);
      if (((pJVar8->m_date).m_grfval & 8) == 0) {
        bVar4 = NumberUtilities::IsNan((pJVar8->m_date).m_tvUtc);
        if (bVar4) {
          return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        }
        pTVar1 = &(pJVar8->m_date).m_grfval;
        *(byte *)pTVar1 = (byte)*pTVar1 | 8;
      }
      uVar2 = (pJVar8->m_date).m_grfval;
      if ((uVar2 & 2) == 0) {
        if ((uVar2 & 1) == 0) {
          dVar10 = DateImplementation::GetTvLcl<Js::ScriptContext>
                             ((pJVar8->m_date).m_tvUtc,scriptContext,&(pJVar8->m_date).m_tzd);
          (pJVar8->m_date).m_tvLcl = dVar10;
          pTVar1 = &(pJVar8->m_date).m_grfval;
          *(byte *)pTVar1 = (byte)*pTVar1 | 1;
        }
        DateUtilities::GetYmdFromTv((pJVar8->m_date).m_tvLcl,&(pJVar8->m_date).m_ymdLcl);
        pTVar1 = &(pJVar8->m_date).m_grfval;
        *(byte *)pTVar1 = (byte)*pTVar1 | 2;
      }
      return (Var)((ulong)((pJVar8->m_date).m_ymdLcl.year - 0x76c) | 0x1000000000000);
    }
  }
  local_38 = (Var)0x0;
  BVar5 = TryInvokeRemotely(EntryGetYear,pSVar9,(Arguments *)&result,&local_38);
  if (BVar5 != 0) {
    return local_38;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.getYear");
}

Assistant:

Var JavascriptDate::EntryGetYear(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryGetYear, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.getYear"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        if (!date->m_date.IsNaN())
        {
            return date->m_date.GetYear(scriptContext);
        }
        return scriptContext->GetLibrary()->GetNaN();
    }